

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupPermFlop(Gia_Man_t *p,Vec_Int_t *vFfPerm)

{
  int iVar1;
  Vec_Int_t *p_00;
  ulong uVar2;
  Gia_Man_t *p_01;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  if (vFfPerm->nSize != p->nRegs) {
    __assert_fail("Vec_IntSize(vFfPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x2e5,"Gia_Man_t *Gia_ManDupPermFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar7 = 0;
  p_00 = Vec_IntAlloc(0);
  if ((long)vFfPerm->nSize != 0) {
    iVar9 = *vFfPerm->pArray;
    for (lVar6 = 1; lVar6 < vFfPerm->nSize; lVar6 = lVar6 + 1) {
      iVar1 = vFfPerm->pArray[lVar6];
      if (iVar9 <= iVar1) {
        iVar9 = iVar1;
      }
    }
    uVar8 = iVar9 + 1;
    Vec_IntGrow(p_00,uVar8);
    uVar2 = 0;
    uVar5 = 0;
    if (0 < (int)uVar8) {
      uVar5 = (ulong)uVar8;
    }
    for (; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      p_00->pArray[uVar2] = -1;
    }
    p_00->nSize = uVar8;
    for (iVar9 = 0; iVar9 < vFfPerm->nSize; iVar9 = iVar9 + 1) {
      iVar1 = Vec_IntEntry(vFfPerm,iVar9);
      if (iVar1 != -1) {
        Vec_IntWriteEntry(p_00,iVar1,iVar9);
      }
    }
  }
  p_01 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar3;
  p->pObjs->Value = 0;
  for (; iVar7 < p->vCis->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCi(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar8 = Gia_ManAppendCi(p_01);
    pGVar4->Value = uVar8;
  }
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar8 = Gia_ManAppendCi(p_01);
    iVar9 = Vec_IntEntry(p_00,iVar7);
    pGVar4 = Gia_ManRo(p,iVar9);
    pGVar4->Value = uVar8;
  }
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManObj(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar9 = Gia_ObjFanin0Copy(pGVar4);
      iVar1 = Gia_ObjFanin1Copy(pGVar4);
      uVar8 = Gia_ManAppendAnd(p_01,iVar9,iVar1);
      pGVar4->Value = uVar8;
    }
  }
  for (iVar7 = 0; iVar7 < p->vCos->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCo(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar9 = Gia_ObjFanin0Copy(pGVar4);
    uVar8 = Gia_ManAppendCo(p_01,iVar9);
    pGVar4->Value = uVar8;
  }
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar9 = Vec_IntEntry(p_00,iVar7);
    pObj = Gia_ManRi(p,iVar9);
    iVar9 = Gia_ObjFanin0Copy(pObj);
    uVar8 = Gia_ManAppendCo(p_01,iVar9);
    pGVar4->Value = uVar8;
  }
  Vec_IntFree(p_00);
  Gia_ManSetRegNum(p_01,p->nRegs);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupPermFlop( Gia_Man_t * p, Vec_Int_t * vFfPerm )
{
    Vec_Int_t * vPermInv;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vFfPerm) == Gia_ManRegNum(p) );
    vPermInv = Vec_IntInvert( vFfPerm, -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManRo(p, Vec_IntEntry(vPermInv, i))->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vPermInv, i)) ) );
    Vec_IntFree( vPermInv );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}